

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseWhileExpr(Parser *this)

{
  string *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_98;
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> body;
  undefined1 local_50 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> condition;
  Token keyword;
  Parser *this_local;
  
  Token::Token((Token *)&condition,(Token *)&in_RSI[5].field_2);
  parseExpr((Parser *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected \'{\' or \'=>\' before while loop body.",&local_89);
  expectBlock((Parser *)local_68,in_RSI);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::
  make_unique<enact::WhileExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>,enact::Token>
            (&local_98,
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_50,
             (Token *)local_68);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<enact::WhileExpr,std::default_delete<enact::WhileExpr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
             (unique_ptr<enact::WhileExpr,_std::default_delete<enact::WhileExpr>_> *)&local_98);
  std::unique_ptr<enact::WhileExpr,_std::default_delete<enact::WhileExpr>_>::~unique_ptr
            ((unique_ptr<enact::WhileExpr,_std::default_delete<enact::WhileExpr>_> *)&local_98);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
            ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_68);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_50);
  Token::~Token((Token *)&condition);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseWhileExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before while loop body.");

        return std::make_unique<WhileExpr>(std::move(condition), std::move(body), std::move(keyword));
    }